

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

png_fixed_point png_reciprocal(png_fixed_point a)

{
  double dVar1;
  double r;
  png_fixed_point a_local;
  
  dVar1 = floor(10000000000.0 / (double)a + 0.5);
  if ((2147483647.0 < dVar1) || (dVar1 < -2147483648.0)) {
    r._4_4_ = 0;
  }
  else {
    r._4_4_ = (int)dVar1;
  }
  return r._4_4_;
}

Assistant:

png_fixed_point
png_reciprocal(png_fixed_point a)
{
#ifdef PNG_FLOATING_ARITHMETIC_SUPPORTED
   double r = floor(1E10/a+.5);

   if (r <= 2147483647. && r >= -2147483648.)
      return (png_fixed_point)r;
#else
   png_fixed_point res;

   if (png_muldiv(&res, 100000, 100000, a) != 0)
      return res;
#endif

   return 0; /* error/overflow */
}